

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O2

void __thiscall cmUVJobServerClient::Impl::RequestImplicitToken(Impl *this)

{
  if (this->HeldTokens == 0) {
    ::cm::uv_idle_ptr::start
              (&this->ImplicitToken,RequestImplicitToken::anon_class_1_0_00000001::__invoke);
    return;
  }
  __assert_fail("this->HeldTokens == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmUVJobServerClient.cxx"
                ,0x74,"void cmUVJobServerClient::Impl::RequestImplicitToken()");
}

Assistant:

void cmUVJobServerClient::Impl::RequestImplicitToken()
{
  assert(this->HeldTokens == 0);
  this->ImplicitToken.start([](uv_idle_t* handle) {
    uv_idle_stop(handle);
    auto* self = static_cast<Impl*>(handle->data);
    self->HoldToken();
  });
}